

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

uint64_t roaring64_bitmap_range_cardinality(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  uint16_t uVar1;
  int iVar2;
  ulong in_RDX;
  ulong in_RSI;
  leaf_t *leaf;
  int max_compare_result;
  art_iterator_t it;
  uint16_t max_low16;
  uint8_t max_high48 [6];
  uint16_t min_low16;
  uint8_t min_high48 [6];
  uint64_t cardinality;
  art_key_chunk_t *in_stack_ffffffffffffff28;
  art_key_chunk_t *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  art_t *in_stack_ffffffffffffff40;
  art_key_chunk_t *local_b8;
  uint64_t local_28;
  uint64_t local_8;
  
  if (in_RSI < in_RDX) {
    local_28 = 0;
    uVar1 = split_key((uint64_t)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    split_key((uint64_t)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    art_lower_bound(in_stack_ffffffffffffff40,
                    (art_key_chunk_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                   );
    while ((local_b8 != (art_key_chunk_t *)0x0 &&
           (iVar2 = compare_high48(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28), iVar2 < 1))
          ) {
      in_stack_ffffffffffffff30 = local_b8;
      if (iVar2 == 0) {
        iVar2 = container_rank(in_stack_ffffffffffffff28,'\0',0);
      }
      else {
        iVar2 = container_get_cardinality(in_stack_ffffffffffffff28,'\0');
      }
      local_28 = (long)iVar2 + local_28;
      iVar2 = compare_high48(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      if ((iVar2 == 0) && (uVar1 != 0)) {
        iVar2 = container_rank(in_stack_ffffffffffffff28,'\0',0);
        local_28 = local_28 - (long)iVar2;
      }
      art_iterator_next((art_iterator_t *)0x10e23e);
    }
    local_8 = local_28;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64_t roaring64_bitmap_range_cardinality(const roaring64_bitmap_t *r,
                                            uint64_t min, uint64_t max) {
    if (min >= max) {
        return 0;
    }
    max--;  // A closed range is easier to work with.

    uint64_t cardinality = 0;
    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);

    art_iterator_t it = art_lower_bound(&r->art, min_high48);
    while (it.value != NULL) {
        int max_compare_result = compare_high48(it.key, max_high48);
        if (max_compare_result > 0) {
            // We're outside the range.
            break;
        }

        leaf_t *leaf = (leaf_t *)it.value;
        if (max_compare_result == 0) {
            // We're at the max high key, add only the range up to the low
            // 16 bits of max.
            cardinality +=
                container_rank(leaf->container, leaf->typecode, max_low16);
        } else {
            // We're not yet at the max high key, add the full container
            // range.
            cardinality +=
                container_get_cardinality(leaf->container, leaf->typecode);
        }
        if (compare_high48(it.key, min_high48) == 0 && min_low16 > 0) {
            // We're at the min high key, remove the range up to the low 16
            // bits of min.
            cardinality -=
                container_rank(leaf->container, leaf->typecode, min_low16 - 1);
        }
        art_iterator_next(&it);
    }
    return cardinality;
}